

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

int32_t __thiscall
SQCompilation::CheckerVisitor::normalizeParamNameLength(CheckerVisitor *this,SQChar *name)

{
  int32_t r;
  
  r = 0;
  do {
    if (*name != '_') {
      if (*name == '\0') {
        return r;
      }
      r = r + 1;
    }
    name = name + 1;
  } while( true );
}

Assistant:

int32_t CheckerVisitor::normalizeParamNameLength(const SQChar *name) {
  int32_t r = 0;

  while (*name) {
    if (*name != '_')
      ++r;
    ++name;
  }

  return r;
}